

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagStackFrame.cpp
# Opt level: O0

void __thiscall
Js::DiagStackFrame::TryFetchValueAndAddress
          (DiagStackFrame *this,char16 *source,int sourceLength,ResolvedObject *pOutResolvedObj)

{
  GlobalObject *pGVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  undefined4 *puVar6;
  undefined4 extraout_var;
  ThreadContext *this_00;
  DebugManager *this_01;
  ReferencedArenaAdapter *this_02;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar7;
  LocalsWalker *this_03;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  byte local_81;
  code *pcStack_80;
  bool isConst;
  undefined8 local_78;
  TrackAllocData local_70;
  LocalsWalker *local_48;
  IDiagObjectModelWalkerBase *localsWalker;
  ArenaAllocator *arena;
  PropertyRecord *propRecord;
  ScriptContext *scriptContext;
  ResolvedObject *pOutResolvedObj_local;
  char16 *pcStack_18;
  int sourceLength_local;
  char16 *source_local;
  DiagStackFrame *this_local;
  
  scriptContext = (ScriptContext *)pOutResolvedObj;
  pOutResolvedObj_local._4_4_ = sourceLength;
  pcStack_18 = source;
  source_local = (char16 *)this;
  if (source == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagStackFrame.cpp"
                                ,0xa8,"(source)","source");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagStackFrame.cpp"
                                ,0xa9,"(pOutResolvedObj)","pOutResolvedObj");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  iVar4 = (*this->_vptr_DiagStackFrame[10])();
  propRecord = (PropertyRecord *)CONCAT44(extraout_var,iVar4);
  ScriptContext::FindPropertyRecord
            ((ScriptContext *)propRecord,pcStack_18,pOutResolvedObj_local._4_4_,
             (PropertyRecord **)&arena);
  if (arena != (ArenaAllocator *)0x0) {
    this_00 = ScriptContext::GetThreadContext((ScriptContext *)propRecord);
    this_01 = ThreadContext::GetDebugManager(this_00);
    this_02 = DebugManager::GetDiagnosticArena(this_01);
    pAVar7 = &Memory::ReferencedArenaAdapter::Arena(this_02)->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    localsWalker = (IDiagObjectModelWalkerBase *)pAVar7;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_70,(type_info *)&LocalsWalker::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagStackFrame.cpp"
               ,0xb3);
    pAVar7 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar7,&local_70);
    pcStack_80 = Memory::ArenaAllocator::Alloc;
    local_78 = 0;
    this_03 = (LocalsWalker *)new<Memory::ArenaAllocator>(0x28,(ArenaAllocator *)pAVar7,0x3f67b0);
    LocalsWalker::LocalsWalker(this_03,this,2);
    local_81 = 0;
    local_48 = this_03;
    uVar5 = PropertyRecord::GetPropertyId((PropertyRecord *)arena);
    iVar4 = (*(this_03->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase[3])
                      (this_03,(ulong)uVar5,&local_81);
    (scriptContext->super_ScriptContextBase).globalObject =
         (GlobalObject *)CONCAT44(extraout_var_00,iVar4);
    if ((scriptContext->super_ScriptContextBase).globalObject != (GlobalObject *)0x0) {
      pGVar1 = (scriptContext->super_ScriptContextBase).globalObject;
      iVar4 = (*(pGVar1->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
                super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[2]
              )(pGVar1,0);
      (scriptContext->super_ScriptContextBase).pActiveScriptDirect =
           (IActiveScriptDirect *)CONCAT44(extraout_var_01,iVar4);
      *(byte *)((long)&scriptContext->prev + 4) = local_81 & 1;
    }
  }
  return;
}

Assistant:

void DiagStackFrame::TryFetchValueAndAddress(const char16 *source, int sourceLength, Js::ResolvedObject * pOutResolvedObj)
    {
        Assert(source);
        Assert(pOutResolvedObj);

        Js::ScriptContext* scriptContext = this->GetScriptContext();

        Js::PropertyRecord const * propRecord;
        scriptContext->FindPropertyRecord(source, sourceLength, &propRecord);
        if (propRecord != nullptr)
        {
            ArenaAllocator *arena = scriptContext->GetThreadContext()->GetDebugManager()->GetDiagnosticArena()->Arena();

            Js::IDiagObjectModelWalkerBase * localsWalker = Anew(arena, Js::LocalsWalker, this, Js::FrameWalkerFlags::FW_EnumWithScopeAlso);

            bool isConst = false;
            pOutResolvedObj->address = localsWalker->FindPropertyAddress(propRecord->GetPropertyId(), isConst);
            if (pOutResolvedObj->address != nullptr)
            {
                pOutResolvedObj->obj = pOutResolvedObj->address->GetValue(FALSE);
                pOutResolvedObj->isConst = isConst;
            }
        }

    }